

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateNegation
          (ScalarEvolutionAnalysis *this,SENode *operand)

{
  bool bVar1;
  int iVar2;
  SEConstantNode *this_00;
  int64_t iVar3;
  pointer pSVar4;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_30;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_28;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> negation_node;
  SENode *operand_local;
  ScalarEvolutionAnalysis *this_local;
  
  negation_node._M_t.
  super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
          )operand;
  bVar1 = SENode::IsCantCompute(operand);
  if (bVar1) {
    this_local = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)
                        negation_node._M_t.
                        super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl)();
    if (iVar2 == 0) {
      this_00 = (SEConstantNode *)
                (**(code **)(*(long *)negation_node._M_t.
                                      super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>.
                                      _M_head_impl + 0x20))();
      iVar3 = SEConstantNode::FoldToSingleValue(this_00);
      this_local = (ScalarEvolutionAnalysis *)CreateConstant(this,-iVar3);
    }
    else {
      pSVar4 = (pointer)operator_new(0x30);
      SENegative::SENegative((SENegative *)pSVar4,this);
      std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
      unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
                ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
                 &local_28,pSVar4);
      pSVar4 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
               operator->(&local_28);
      (*pSVar4->_vptr_SENode[3])
                (pSVar4,negation_node._M_t.
                        super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      unique_ptr(&local_30,&local_28);
      this_local = (ScalarEvolutionAnalysis *)GetCachedOrAdd(this,&local_30);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr(&local_30);
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr(&local_28);
    }
  }
  return (SENode *)this_local;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateNegation(SENode* operand) {
  // If operand is can't compute then the whole graph is can't compute.
  if (operand->IsCantCompute()) return CreateCantComputeNode();

  if (operand->GetType() == SENode::Constant) {
    return CreateConstant(-operand->AsSEConstantNode()->FoldToSingleValue());
  }
  std::unique_ptr<SENode> negation_node{new SENegative(this)};
  negation_node->AddChild(operand);
  return GetCachedOrAdd(std::move(negation_node));
}